

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utXImporterExporter.cpp
# Opt level: O2

void __thiscall
utXImporterExporter_heap_overflow_in_tokenizer_Test::TestBody
          (utXImporterExporter_heap_overflow_in_tokenizer_Test *this)

{
  bool bVar1;
  AssertHelper local_20;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  Importer importer;
  
  Assimp::Importer::Importer(&importer);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      Assimp::Importer::ReadFile
                (&importer,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/X/OV_GetNextToken"
                 ,0);
    }
  }
  else {
    testing::Message::Message((Message *)&local_18);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utXImporterExporter.cpp"
               ,0x44,
               "Expected: importer.ReadFile( \"/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models\" \"/X/OV_GetNextToken\", 0 ) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_18);
  }
  Assimp::Importer::~Importer(&importer);
  return;
}

Assistant:

TEST_F( utXImporterExporter, heap_overflow_in_tokenizer ) {
    Assimp::Importer importer;
    EXPECT_NO_THROW( importer.ReadFile( ASSIMP_TEST_MODELS_DIR "/X/OV_GetNextToken", 0 ) );
}